

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O3

Flags * __thiscall pstack::Flags::done(Flags *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<option,_std::allocator<option>_> *__range1;
  option *opt;
  option *poVar1;
  iterator __position;
  option local_48;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (this_00,0,*(size_type *)(this + 0x50),"",0);
  poVar1 = *(option **)this;
  __position._M_current = *(option **)(this + 8);
  if (poVar1 != __position._M_current) {
    do {
      if (0 < poVar1->val) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,(char)poVar1->val);
        if (poVar1->has_arg != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (this_00,':');
        }
      }
      poVar1 = poVar1 + 1;
    } while (poVar1 != __position._M_current);
    __position._M_current = *(option **)(this + 8);
  }
  local_48.flag = (int *)0x0;
  local_48.val = 0;
  local_48._28_4_ = 0;
  local_48.name = (char *)0x0;
  local_48.has_arg = 0;
  local_48._12_4_ = 0;
  if (__position._M_current == *(option **)(this + 0x10)) {
    std::vector<option,_std::allocator<option>_>::_M_realloc_insert<option>
              ((vector<option,_std::allocator<option>_> *)this,__position,&local_48);
  }
  else {
    (__position._M_current)->flag = (int *)0x0;
    *(undefined8 *)&(__position._M_current)->val = 0;
    (__position._M_current)->name = (char *)0x0;
    *(undefined8 *)&(__position._M_current)->has_arg = 0;
    *(long *)(this + 8) = *(long *)(this + 8) + 0x20;
  }
  return this;
}

Assistant:

const Flags &
Flags::done()
{
    shortOptions = "";
    for (auto &opt : longOptions) {
        if (opt.val > 0) {
           shortOptions += char(opt.val);
           if (opt.has_arg != 0)
               shortOptions += ':';
        }
    }
    longOptions.push_back({nullptr, 0, nullptr, 0});
    return *this;
}